

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool Fossilize::parse_blacklist_environments
               (Value *envs,vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *infos)

{
  bool bVar1;
  Pointer pVVar2;
  Ch *pCVar3;
  Type pGVar4;
  undefined1 local_a0 [8];
  EnvInfo env_info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  ConstMemberIterator itr;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *infos_local;
  Value *envs_local;
  
  itr.ptr_ = (Pointer)infos;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(envs);
  if (bVar1) {
    std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::clear
              ((vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)itr.ptr_);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(envs);
    while( true ) {
      elem = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd(envs);
      bVar1 = rapidjson::
              GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_28,
                           (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&elem);
      if (!bVar1) break;
      pVVar2 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_28);
      env_info._96_8_ = &pVVar2->value;
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)env_info._96_8_);
      if (!bVar1) {
        fprintf(_stderr,"Fossilize ERROR: blacklistEnvironment element must be object.\n");
        return false;
      }
      EnvInfo::EnvInfo((EnvInfo *)local_a0);
      pVVar2 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_28);
      pCVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&pVVar2->name);
      std::__cxx11::string::operator=((string *)local_a0,pCVar3);
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)env_info._96_8_,"contains");
      if (bVar1) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)env_info._96_8_,"contains");
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(pGVar4);
        if (bVar1) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)env_info._96_8_,"contains");
          pCVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pGVar4);
          std::__cxx11::string::operator=((string *)(env_info.env.field_2._M_local_buf + 8),pCVar3);
        }
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)env_info._96_8_,"equals");
      if (bVar1) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)env_info._96_8_,"equals");
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(pGVar4);
        if (bVar1) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)env_info._96_8_,"equals");
          pCVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pGVar4);
          std::__cxx11::string::operator=
                    ((string *)(env_info.contains.field_2._M_local_buf + 8),pCVar3);
        }
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)env_info._96_8_,"nonnull");
      if (bVar1) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)env_info._96_8_,"nonnull");
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsBool(pGVar4);
        if (bVar1) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)env_info._96_8_,"nonnull");
          env_info.equals.field_2._M_local_buf[8] =
               rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetBool(pGVar4);
        }
      }
      std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::push_back
                ((vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)itr.ptr_,
                 (value_type *)local_a0);
      EnvInfo::~EnvInfo((EnvInfo *)local_a0);
      rapidjson::
      GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::operator++(&local_28);
    }
    envs_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: blacklistedEnvironments must be an object.\n");
    envs_local._7_1_ = false;
  }
  return envs_local._7_1_;
}

Assistant:

static bool parse_blacklist_environments(const Value &envs, std::vector<EnvInfo> &infos)
{
	if (!envs.IsObject())
	{
		LOGE("blacklistedEnvironments must be an object.\n");
		return false;
	}

	infos.clear();

	for (auto itr = envs.MemberBegin(); itr != envs.MemberEnd(); ++itr)
	{
		auto &elem = itr->value;
		if (!elem.IsObject())
		{
			LOGE("blacklistEnvironment element must be object.\n");
			return false;
		}

		EnvInfo env_info;

		env_info.env = itr->name.GetString();
		if (elem.HasMember("contains") && elem["contains"].IsString())
			env_info.contains = elem["contains"].GetString();
		if (elem.HasMember("equals") && elem["equals"].IsString())
			env_info.equals = elem["equals"].GetString();
		if (elem.HasMember("nonnull") && elem["nonnull"].IsBool())
			env_info.nonnull = elem["nonnull"].GetBool();

		infos.push_back(std::move(env_info));
	}

	return true;
}